

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O3

void cf_h1_proxy_close(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_cfilter *pCVar1;
  curl_trc_feat *pcVar2;
  
  if ((data == (Curl_easy *)0x0) || (((data->set).field_0x89f & 0x40) == 0)) {
LAB_00114110:
    if (cf == (Curl_cfilter *)0x0) {
      return;
    }
  }
  else {
    pcVar2 = (data->state).feat;
    if (pcVar2 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) {
        return;
      }
    }
    else if ((cf == (Curl_cfilter *)0x0) || (pcVar2->log_level < 1)) goto LAB_00114110;
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"close");
    }
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  if ((h1_tunnel_state_conflict *)cf->ctx != (h1_tunnel_state_conflict *)0x0) {
    h1_tunnel_go_state(cf,(h1_tunnel_state_conflict *)cf->ctx,H1_TUNNEL_INIT,data);
  }
  pCVar1 = cf->next;
  if (pCVar1 == (Curl_cfilter *)0x0) {
    return;
  }
  (*(code *)pCVar1->cft->do_close)(pCVar1,data);
  return;
}

Assistant:

static void cf_h1_proxy_close(struct Curl_cfilter *cf,
                              struct Curl_easy *data)
{
  CURL_TRC_CF(data, cf, "close");
  if(cf) {
    cf->connected = FALSE;
    if(cf->ctx) {
      h1_tunnel_go_state(cf, cf->ctx, H1_TUNNEL_INIT, data);
    }
    if(cf->next)
      cf->next->cft->do_close(cf->next, data);
  }
}